

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# have_sys_socket.c
# Opt level: O3

network_target * sys_socket_open_udp6_target(network_target *target)

{
  int iVar1;
  network_target *pnVar2;
  
  lock_network_target(target);
  iVar1 = getaddrinfo_int_connect(target->destination,target->port,10,2,0);
  target->handle = iVar1;
  unlock_network_target(target);
  pnVar2 = (network_target *)0x0;
  if (iVar1 != -1) {
    pnVar2 = target;
  }
  return pnVar2;
}

Assistant:

struct network_target *
sys_socket_open_udp6_target( struct network_target *target ) {
  int result;

  lock_network_target( target );
  result = config_int_connect( target->destination,
                               target->port,
                               AF_INET6,
                               SOCK_DGRAM,
                               0 );
  target->handle = result;
  unlock_network_target( target );

  return result == -1 ? NULL : target;
}